

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void __thiscall
google::protobuf::Reflection::UnsafeArenaSetAllocatedMessage
          (Reflection *this,Message *message,Message *sub_message,FieldDescriptor *field)

{
  ReflectionSchema *this_00;
  int number;
  long *plVar1;
  bool bVar2;
  CppType CVar3;
  uint32 uVar4;
  Type TVar5;
  ulong uVar6;
  
  if (*(Descriptor **)(field + 0x50) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"SetAllocatedMessage","Field does not match message type.");
  }
  if (*(int *)(field + 0x3c) == 3) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"SetAllocatedMessage",
               "Field is repeated; the method requires a singular field.");
  }
  CVar3 = FieldDescriptor::cpp_type(field);
  if (CVar3 != CPPTYPE_MESSAGE) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"SetAllocatedMessage",CPPTYPE_MESSAGE);
  }
  this_00 = &this->schema_;
  if (field[0x43] == (FieldDescriptor)0x1) {
    uVar4 = internal::ReflectionSchema::GetExtensionSetOffset(this_00);
    number = *(int *)(field + 0x44);
    TVar5 = FieldDescriptor::type(field);
    internal::ExtensionSet::UnsafeArenaSetAllocatedMessage
              ((ExtensionSet *)
               ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar4),number,
               (FieldType)TVar5,field,&sub_message->super_MessageLite);
    return;
  }
  bVar2 = internal::ReflectionSchema::InRealOneof(this_00,field);
  if (bVar2) {
    ClearOneof(this,message,*(OneofDescriptor **)(field + 0x58));
    if (sub_message != (Message *)0x0) {
      uVar4 = internal::ReflectionSchema::GetFieldOffset(this_00,field);
      *(Message **)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar4) =
           sub_message;
      SetOneofCase(this,message,field);
      return;
    }
  }
  else {
    if (sub_message == (Message *)0x0) {
      ClearBit(this,message,field);
    }
    else {
      SetBit(this,message,field);
    }
    uVar4 = internal::ReflectionSchema::GetFieldOffset(this_00,field);
    uVar6 = *(ulong *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                      (ulong)(uint)(this->schema_).metadata_offset_);
    if ((uVar6 & 1) != 0) {
      uVar6 = *(ulong *)(uVar6 & 0xfffffffffffffffe);
    }
    if ((uVar6 == 0) &&
       (plVar1 = *(long **)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar4),
       plVar1 != (long *)0x0)) {
      (**(code **)(*plVar1 + 8))();
    }
    *(Message **)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar4) =
         sub_message;
  }
  return;
}

Assistant:

void Reflection::UnsafeArenaSetAllocatedMessage(
    Message* message, Message* sub_message,
    const FieldDescriptor* field) const {
  USAGE_CHECK_ALL(SetAllocatedMessage, SINGULAR, MESSAGE);

  if (field->is_extension()) {
    MutableExtensionSet(message)->UnsafeArenaSetAllocatedMessage(
        field->number(), field->type(), field, sub_message);
  } else {
    if (schema_.InRealOneof(field)) {
      if (sub_message == nullptr) {
        ClearOneof(message, field->containing_oneof());
        return;
      }
        ClearOneof(message, field->containing_oneof());
        *MutableRaw<Message*>(message, field) = sub_message;
      SetOneofCase(message, field);
      return;
    }

    if (sub_message == nullptr) {
      ClearBit(message, field);
    } else {
      SetBit(message, field);
    }
    Message** sub_message_holder = MutableRaw<Message*>(message, field);
    if (GetArena(message) == nullptr) {
      delete *sub_message_holder;
    }
    *sub_message_holder = sub_message;
  }
}